

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ustar.c
# Opt level: O2

int archive_write_ustar_finish_entry(archive_write *a)

{
  long *plVar1;
  int iVar2;
  
  plVar1 = (long *)a->format_data;
  iVar2 = __archive_write_nulls(a,plVar1[1] + *plVar1);
  *plVar1 = 0;
  plVar1[1] = 0;
  return iVar2;
}

Assistant:

static int
archive_write_ustar_finish_entry(struct archive_write *a)
{
	struct ustar *ustar;
	int ret;

	ustar = (struct ustar *)a->format_data;
	ret = __archive_write_nulls(a,
	    (size_t)(ustar->entry_bytes_remaining + ustar->entry_padding));
	ustar->entry_bytes_remaining = ustar->entry_padding = 0;
	return (ret);
}